

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O3

Result __thiscall wabt::WastParser::ParseExportModuleField(WastParser *this,Module *module)

{
  Result RVar1;
  Enum EVar2;
  _Head_base<0UL,_wabt::ExportModuleField_*,_false> local_90;
  Token local_88;
  Location local_48;
  
  RVar1 = Expect(this,Lpar);
  EVar2 = Error;
  if (RVar1.enum_ != Error) {
    GetToken(&local_88,this);
    local_48.field_1.field_1.offset = local_88.loc.field_1.field_1.offset;
    local_48.field_1._8_8_ = local_88.loc.field_1._8_8_;
    local_48.filename.data_ = local_88.loc.filename.data_;
    local_48.filename.size_ = local_88.loc.filename.size_;
    MakeUnique<wabt::ExportModuleField,wabt::Location>((wabt *)&local_88,&local_48);
    RVar1 = Expect(this,Export);
    EVar2 = Error;
    if (RVar1.enum_ != Error) {
      RVar1 = ParseQuotedText(this,(string *)((long)local_88.loc.filename.data_ + 0x40));
      if (RVar1.enum_ != Error) {
        RVar1 = ParseExportDesc(this,(Export *)((long)local_88.loc.filename.data_ + 0x40));
        if (RVar1.enum_ != Error) {
          RVar1 = Expect(this,Rpar);
          if (RVar1.enum_ != Error) {
            local_90._M_head_impl = (ExportModuleField *)local_88.loc.filename.data_;
            local_88.loc.filename.data_ = (char *)0x0;
            Module::AppendField(module,(unique_ptr<wabt::ExportModuleField,_std::default_delete<wabt::ExportModuleField>_>
                                        *)&local_90);
            if (local_90._M_head_impl != (ExportModuleField *)0x0) {
              (*((local_90._M_head_impl)->super_ModuleFieldMixin<(wabt::ModuleFieldType)3>).
                super_ModuleField._vptr_ModuleField[1])();
            }
            local_90._M_head_impl = (ExportModuleField *)0x0;
            EVar2 = Ok;
          }
        }
      }
    }
    if ((ExportModuleField *)local_88.loc.filename.data_ != (ExportModuleField *)0x0) {
      (*(((ModuleFieldMixin<(wabt::ModuleFieldType)3> *)local_88.loc.filename.data_)->
        super_ModuleField)._vptr_ModuleField[1])();
    }
  }
  return (Result)EVar2;
}

Assistant:

Result WastParser::ParseExportModuleField(Module* module) {
  WABT_TRACE(ParseExportModuleField);
  EXPECT(Lpar);
  auto field = MakeUnique<ExportModuleField>(GetLocation());
  EXPECT(Export);
  CHECK_RESULT(ParseQuotedText(&field->export_.name));
  CHECK_RESULT(ParseExportDesc(&field->export_));
  EXPECT(Rpar);
  module->AppendField(std::move(field));
  return Result::Ok;
}